

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall
OpenMD::Electrostatic::calcSurfaceTerm(Electrostatic *this,bool slabGeometry,int axis,RealType *pot)

{
  int iVar1;
  AtomType *pAVar2;
  reference pvVar3;
  SnapshotManager *pSVar4;
  double *pdVar5;
  SimInfo *v1;
  double *in_RCX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  RealType RVar6;
  Vector3d *pos;
  Snapshot *this_00;
  Atom *atom_1;
  Molecule *mol_1;
  int axis2;
  int axis1;
  RealType prefactor;
  RealType V;
  Atom *atom;
  Molecule *mol;
  RealType eConverter;
  RealType mPoleConverter;
  ElectrostaticAtomData data;
  int atid;
  Vector3d netDipole;
  Vector3d t;
  Vector3d D;
  Vector3d r;
  RealType C;
  AtomIterator ai;
  MoleculeIterator mi;
  Electrostatic *in_stack_00000570;
  ElectrostaticAtomData *in_stack_fffffffffffffc18;
  Snapshot *in_stack_fffffffffffffc20;
  SimInfo *in_stack_fffffffffffffc28;
  StuntDouble *in_stack_fffffffffffffc30;
  SimInfo *in_stack_fffffffffffffc38;
  SimInfo *in_stack_fffffffffffffc40;
  SimInfo *v2;
  Vector3d *in_stack_fffffffffffffc98;
  Snapshot *in_stack_fffffffffffffca0;
  SimInfo *local_200;
  Snapshot *local_1f8;
  double local_1e8;
  Atom *local_178;
  Molecule *local_170;
  byte local_148;
  byte local_147;
  byte local_145;
  double local_140;
  double local_b0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90 [4];
  double local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  double *local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = in_RCX;
  local_10 = in_EDX;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  Vector3<double>::Vector3((Vector3<double> *)0x40fed1);
  Vector3<double>::Vector3((Vector3<double> *)0x40fede);
  Vector3<double>::Vector3((Vector3<double> *)0x40feeb);
  local_b0 = 0.0;
  Vector<double,_3U>::Vector(&local_a8,&local_b0);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffc20,
             (Vector<double,_3U> *)in_stack_fffffffffffffc18);
  ElectrostaticAtomData::ElectrostaticAtomData((ElectrostaticAtomData *)in_stack_fffffffffffffc20);
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(in_stack_00000570);
  }
  local_170 = SimInfo::beginMolecule
                        (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
  while (local_170 != (Molecule *)0x0) {
    local_178 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffc40,
                                    (iterator *)in_stack_fffffffffffffc38);
    while (local_178 != (Atom *)0x0) {
      pAVar2 = Atom::getAtomType(local_178);
      iVar1 = AtomType::getIdent(pAVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)iVar1);
      std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
      operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                  *)(in_RDI + 200),(long)*pvVar3);
      ElectrostaticAtomData::operator=
                ((ElectrostaticAtomData *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if ((local_148 & 1) != 0) {
        local_30 = local_140;
        if ((local_145 & 1) != 0) {
          RVar6 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffc20);
          local_30 = RVar6 + local_30;
        }
        StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc28);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc20,
                   (Vector3<double> *)in_stack_fffffffffffffc18);
        pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0xf8));
        SnapshotManager::getCurrentSnapshot(pSVar4);
        Snapshot::wrapVector(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        OpenMD::operator*((double)in_stack_fffffffffffffc28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffc20,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc18);
      }
      if ((local_147 & 1) != 0) {
        StuntDouble::getDipole((StuntDouble *)in_stack_fffffffffffffc28);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffc28,
                          (double)in_stack_fffffffffffffc20);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc28,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffc20,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc18);
      }
      local_178 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffc40,
                                     (iterator *)in_stack_fffffffffffffc38);
    }
    local_170 = SimInfo::nextMolecule
                          (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
  }
  pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0xf8));
  SnapshotManager::getCurrentSnapshot(pSVar4);
  local_1e8 = Snapshot::getVolume(in_stack_fffffffffffffc20);
  if ((local_9 & 1) == 0) {
    local_1e8 = local_1e8 * 3.0;
  }
  else {
    pdVar5 = Vector<double,_3U>::operator[](local_90,local_10 + 1 + ((local_10 + 1) / 3) * -3);
    *pdVar5 = 0.0;
    pdVar5 = Vector<double,_3U>::operator[](local_90,local_10 + 2 + ((local_10 + 2) / 3) * -3);
    *pdVar5 = 0.0;
  }
  local_1e8 = 6.283185307179586 / local_1e8;
  pos = (Vector3d *)(local_1e8 * 332.0637778);
  this_00 = (Snapshot *)Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x41043b);
  *local_18 = (double)pos * (double)this_00 + *local_18;
  local_1f8 = (Snapshot *)
              SimInfo::beginMolecule
                        (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
  while (local_1f8 != (Snapshot *)0x0) {
    v1 = (SimInfo *)
         Molecule::beginAtom((Molecule *)in_stack_fffffffffffffc40,
                             (iterator *)in_stack_fffffffffffffc38);
    local_200 = v1;
    while (local_200 != (SimInfo *)0x0) {
      v2 = local_200;
      OpenMD::operator*((double)in_stack_fffffffffffffc28,
                        (Vector<double,_3U> *)in_stack_fffffffffffffc20);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffc20,
                 (Vector<double,_3U> *)in_stack_fffffffffffffc18);
      StuntDouble::addElectricField(in_stack_fffffffffffffc30,(Vector3d *)in_stack_fffffffffffffc28)
      ;
      pAVar2 = Atom::getAtomType((Atom *)local_200);
      iVar1 = AtomType::getIdent(pAVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)iVar1);
      std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
      operator[]((vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                  *)(in_RDI + 200),(long)*pvVar3);
      ElectrostaticAtomData::operator=
                ((ElectrostaticAtomData *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if ((local_148 & 1) != 0) {
        local_30 = local_140;
        if ((local_145 & 1) != 0) {
          StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc28);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc20,
                     (Vector3<double> *)in_stack_fffffffffffffc18);
          pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0xf8));
          SnapshotManager::getCurrentSnapshot(pSVar4);
          Snapshot::wrapVector(this_00,pos);
          in_stack_fffffffffffffc40 = local_200;
          dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffc30,
                         (Vector<double,_3U> *)in_stack_fffffffffffffc28);
          StuntDouble::addFlucQFrc(in_stack_fffffffffffffc30,(RealType)in_stack_fffffffffffffc28);
        }
        OpenMD::operator*((double)in_stack_fffffffffffffc28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffc20,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc18);
        StuntDouble::addFrc(in_stack_fffffffffffffc30,(Vector3d *)in_stack_fffffffffffffc28);
        in_stack_fffffffffffffc38 = local_200;
      }
      if ((local_147 & 1) != 0) {
        StuntDouble::getDipole((StuntDouble *)in_stack_fffffffffffffc28);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffc28,
                          (double)in_stack_fffffffffffffc20);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc28,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc30 =
             (StuntDouble *)(local_1e8 * -332.0637778 + local_1e8 * -332.0637778);
        cross<double>((Vector3<double> *)v1,(Vector3<double> *)v2);
        OpenMD::operator*((double)in_stack_fffffffffffffc28,
                          (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffc28,
                   (Vector<double,_3U> *)in_stack_fffffffffffffc20);
        StuntDouble::addTrq(in_stack_fffffffffffffc30,(Vector3d *)in_stack_fffffffffffffc28);
      }
      in_stack_fffffffffffffc28 =
           (SimInfo *)
           Molecule::nextAtom((Molecule *)in_stack_fffffffffffffc40,
                              (iterator *)in_stack_fffffffffffffc38);
      local_200 = in_stack_fffffffffffffc28;
    }
    in_stack_fffffffffffffc20 =
         (Snapshot *)
         SimInfo::nextMolecule
                   (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
    local_1f8 = in_stack_fffffffffffffc20;
  }
  ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x410898);
  return;
}

Assistant:

void Electrostatic::calcSurfaceTerm(bool slabGeometry, int axis,
                                      RealType& pot) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    RealType C;
    Vector3d r;
    Vector3d D;
    Vector3d t;
    Vector3d netDipole(0.0);
    int atid;
    ElectrostaticAtomData data;

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    if (!initialized_) initialize();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) C += atom->getFlucQPos();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          netDipole += C * r;
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          netDipole += D;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, netDipole.getArrayPointer(), 3, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif

    RealType V = info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType prefactor;

    if (slabGeometry) {
      prefactor = 2.0 * Constants::PI / V;
      // Compute complementary axes to the privileged axis
      int axis1        = (axis + 1) % 3;
      int axis2        = (axis + 2) % 3;
      netDipole[axis1] = 0.0;
      netDipole[axis2] = 0.0;
    } else {
      prefactor = 2.0 * Constants::PI / (3.0 * V);
    }

    pot += eConverter * prefactor * netDipole.lengthSquare();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atom->addElectricField(-eConverter * prefactor * 2.0 * netDipole);

        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) {
            r = atom->getPos();
            info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);
            atom->addFlucQFrc(-eConverter * prefactor * 2.0 *
                              dot(r, netDipole));
          }
          atom->addFrc(-eConverter * prefactor * 2.0 * C * netDipole);
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          t = -eConverter * prefactor * 2.0 * cross(D, netDipole);
          atom->addTrq(t);
        }
      }
    }
  }